

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractTestExample.cpp
# Opt level: O2

void __thiscall AbstractTestExample::UpdateDataInfo(AbstractTestExample *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  ostream *poVar4;
  int iVar5;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"postive   ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->positiveN);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"negative  ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->negtiveN);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"imbalance ");
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 8) = 4;
  uVar1 = this->positiveN;
  uVar2 = this->negtiveN;
  poVar4 = std::ostream::_M_insert<double>((double)(int)uVar2 / (double)(int)uVar1);
  std::endl<char,std::char_traits<char>>(poVar4);
  iVar5 = (int)((double)this->instanceN * 0.2);
  this->testN = iVar5;
  this->trainN = this->instanceN - iVar5;
  iVar3 = (int)((double)this->positiveN * 0.2);
  this->posNtest = iVar3;
  this->negNtest = iVar5 - iVar3;
  this->posNtrain = this->positiveN - iVar3;
  this->negNtrain = this->negtiveN - (iVar5 - iVar3);
  return;
}

Assistant:

void AbstractTestExample::UpdateDataInfo()
{
    std::cout<<"postive   "<<positiveN<<std::endl;
    std::cout<<"negative  "<<negtiveN<<std::endl;
    std::cout<<"imbalance "<<std::setprecision(4)<<static_cast<double>(negtiveN)/positiveN<<std::endl;
    
    double testRate=0.2;
    testN=instanceN*testRate;
    trainN=instanceN-testN;
    posNtest=positiveN*testRate;
    negNtest=testN-posNtest;
    posNtrain=positiveN-posNtest;
    negNtrain=negtiveN-negNtest;
}